

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::MutableMessage
          (ExtensionSet *this,int number,FieldType type,MessageLite *prototype,
          FieldDescriptor *descriptor)

{
  byte bVar1;
  int iVar2;
  Extension *pEVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar5;
  MessageLite *pMVar4;
  
  pVar5 = Insert(this,number);
  pEVar3 = pVar5.first;
  pEVar3->descriptor = descriptor;
  if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    bVar1 = pEVar3->field_0xa;
    pEVar3->field_0xa = bVar1 & 0xf0;
    pMVar4 = (pEVar3->field_0).message_value;
    if ((bVar1 & 0x10) != 0) {
      iVar2 = (*pMVar4->_vptr_MessageLite[4])
                        (pMVar4,prototype,pVar5._8_8_,pMVar4->_vptr_MessageLite[4]);
      return (MessageLite *)CONCAT44(extraout_var_00,iVar2);
    }
  }
  else {
    pEVar3->type = type;
    pEVar3->is_repeated = false;
    pEVar3->field_0xa = pEVar3->field_0xa & 0xf;
    iVar2 = (*prototype->_vptr_MessageLite[4])(prototype,this->arena_);
    pMVar4 = (MessageLite *)CONCAT44(extraout_var,iVar2);
    (pEVar3->field_0).int64_value = (int64)pMVar4;
    pEVar3->field_0xa = pEVar3->field_0xa & 0xf0;
  }
  return pMVar4;
}

Assistant:

MessageLite* ExtensionSet::MutableMessage(int number, FieldType type,
                                          const MessageLite& prototype,
                                          const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_lazy = false;
    extension->message_value = prototype.New(arena_);
    extension->is_cleared = false;
    return extension->message_value;
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    extension->is_cleared = false;
    if (extension->is_lazy) {
      return extension->lazymessage_value->MutableMessage(prototype);
    } else {
      return extension->message_value;
    }
  }
}